

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isRightAssociative(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((((kind == FollowedByPropertyExpr) || (kind == IffPropertyExpr)) ||
       (kind == ImplicationPropertyExpr)) ||
      ((kind == ImpliesPropertyExpr || (kind - LogicalEquivalenceExpression < 2)))) ||
     ((kind - SUntilPropertyExpr < 2 ||
      ((kind == ThroughoutSequenceExpr ||
       (kind == UntilPropertyExpr || kind == UntilWithPropertyExpr)))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isRightAssociative(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::LogicalImplicationExpression:
        case SyntaxKind::LogicalEquivalenceExpression:
        case SyntaxKind::ThroughoutSequenceExpr:
        case SyntaxKind::IffPropertyExpr:
        case SyntaxKind::UntilPropertyExpr:
        case SyntaxKind::SUntilPropertyExpr:
        case SyntaxKind::UntilWithPropertyExpr:
        case SyntaxKind::SUntilWithPropertyExpr:
        case SyntaxKind::ImpliesPropertyExpr:
        case SyntaxKind::ImplicationPropertyExpr:
        case SyntaxKind::FollowedByPropertyExpr:
            return true;
        default:
            return false;
    }
}